

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O3

int anon_unknown.dwarf_263d3::ChannelOut_pitchbend(lua_State *L)

{
  long *plVar1;
  ulong uVar2;
  char local_1b;
  byte local_1a;
  byte local_19;
  
  plVar1 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  uVar2 = luaL_checkinteger(L,2);
  if (0x3fff < uVar2) {
    luaL_argerror(L,2,"Pitch bend position must be between 0 and 16383");
  }
  local_1b = (char)plVar1[1] + -0x20;
  local_1a = (byte)uVar2 & 0x7f;
  local_19 = (byte)(uVar2 >> 7) & 0x7f;
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),&local_1b,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_pitchbend(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer value = luaL_checkinteger(L, 2);

	luaL_argcheck(L, value >= 0 && value <= 0x3FFF, 2, "Pitch bend position must be between 0 and 16383");

	self.send(0xE0 + self.index, value & 0x7Fu, (value >> 7) & 0x7Fu);
	lua_settop(L, 1);
	return 1;
}